

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O2

void ignore_sval_menu_display
               (menu_conflict *menu,wchar_t oid,_Bool cursor,wchar_t row,wchar_t col,wchar_t width)

{
  _Bool easy_know;
  uint8_t attr;
  byte bVar1;
  object_kind *kind;
  void *pvVar2;
  char *str;
  undefined7 in_register_00000011;
  char buf [80];
  
  pvVar2 = menu_priv(menu);
  kind = *(object_kind **)((long)pvVar2 + (long)oid * 0x10);
  easy_know = *(_Bool *)((long)pvVar2 + (long)oid * 0x10 + 8);
  attr = curs_attrs[easy_know][CONCAT71(in_register_00000011,cursor) & 0xffffffff];
  object_kind_name(buf,0x50,kind,easy_know);
  str = format("[ ] %s",buf);
  c_put_str(attr,str,row,col);
  bVar1 = kind->ignore;
  if (easy_know == true) {
    bVar1 = bVar1 & 1;
  }
  else {
    bVar1 = bVar1 & 2;
  }
  if (bVar1 != 0) {
    c_put_str('\f',"*",row,col + L'\x01');
  }
  return;
}

Assistant:

static void ignore_sval_menu_display(struct menu *menu, int oid, bool cursor,
									 int row, int col, int width)
{
	char buf[80];
	const ignore_choice *choice = menu_priv(menu);

	struct object_kind *kind = choice[oid].kind;
	bool aware = choice[oid].aware;

	uint8_t attr = curs_attrs[(int)aware][0 != cursor];

	/* Acquire the "name" of object "i" */
	object_kind_name(buf, sizeof(buf), kind, aware);

	/* Print it */
	c_put_str(attr, format("[ ] %s", buf), row, col);
	if ((aware && (kind->ignore & IGNORE_IF_AWARE)) ||
			(!aware && (kind->ignore & IGNORE_IF_UNAWARE)))
		c_put_str(COLOUR_L_RED, "*", row, col + 1);
}